

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *data)

{
  pointer pGVar1;
  size_t sVar2;
  size_t __n;
  element_type *peVar3;
  int iVar4;
  invalid_argument *this_00;
  pointer a;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*glad_glBindVertexArray)(this->vaoHandle);
  a = (this->attributes).
      super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = a == pGVar1;
  if (!bVar5) {
    sVar2 = name->_M_string_length;
    do {
      __n = (a->name)._M_string_length;
      bVar6 = true;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar6 = false;
        }
        else {
          iVar4 = bcmp((a->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
          bVar6 = iVar4 != 0;
        }
      }
      if ((!bVar6) && (a->location != -1)) {
        if ((a->buff).
            super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          createBuffer(this,a);
        }
        peVar3 = (a->buff).
                 super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*(peVar3->super_AttributeBuffer)._vptr_AttributeBuffer[3])(peVar3,data);
        if (!bVar5) {
          return;
        }
        break;
      }
      a = a + 1;
      bVar5 = a == pGVar1;
    } while (!bVar5);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Tried to set nonexistent attribute with name ",name);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<glm::vec3>& data) {
  glBindVertexArray(vaoHandle); // TODO remove these?

  // pass-through to the buffer
  for (GLShaderAttribute& a : attributes) {
    if (a.name == name && a.location != -1) {
      ensureBufferExists(a);
      a.buff->setData(data);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}